

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O2

void anon_unknown.dwarf_26dca::print_filter_info(item *item,bool temp)

{
  ostream *poVar1;
  char *pcVar2;
  
  if ((item->languages)._M_string_length == 0) {
    if (!temp) {
      return;
    }
    pcVar2 = " [";
  }
  else {
    std::operator<<((ostream *)&std::cout," [");
    poVar1 = color::operator<<((ostream *)&std::cout,(shell_command)color::green);
    poVar1 = std::operator<<(poVar1,(string *)&item->languages);
    color::operator<<(poVar1,(shell_command)color::reset);
    if (!temp) goto LAB_0011d5a3;
    pcVar2 = ", ";
  }
  std::operator<<((ostream *)&std::cout,pcVar2);
  poVar1 = color::operator<<((ostream *)&std::cout,(shell_command)color::cyan);
  poVar1 = std::operator<<(poVar1,"temp");
  color::operator<<(poVar1,(shell_command)color::reset);
LAB_0011d5a3:
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

void print_filter_info(const setup::item & item, bool temp) {
	
	bool first = true;
	
	if(!item.languages.empty()) {
		std::cout << " [";
		first = false;
		std::cout << color::green << item.languages << color::reset;
	}
	
	if(temp) {
		std::cout << (first ? " [" : ", ");
		first = false;
		std::cout << color::cyan << "temp" << color::reset;
		
	}
	
	if(!first) {
		std::cout << "]";
	}
	
}